

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

search_result
search_hd_table(nghttp2_hd_context *context,nghttp2_nv *nv,int32_t token,int indexing_mode,
               nghttp2_hd_map *map,uint32_t hash)

{
  search_result sVar1;
  int local_5c;
  int name_only;
  int exact_match;
  nghttp2_hd_entry *ent;
  search_result res;
  uint32_t hash_local;
  nghttp2_hd_map *map_local;
  int indexing_mode_local;
  int32_t token_local;
  nghttp2_nv *nv_local;
  nghttp2_hd_context *context_local;
  int local_10;
  
  ent = (nghttp2_hd_entry *)0xffffffffffffffff;
  res.index = 0;
  local_5c = 0;
  res._12_4_ = hash;
  _name_only = hd_map_find(map,&local_5c,nv,token,hash,(uint)(indexing_mode == 2));
  if (((local_5c == 0) && (-1 < token)) && (token < 0x3d)) {
    sVar1 = search_static_table(nv,token,(uint)(indexing_mode == 2));
    context_local = (nghttp2_hd_context *)sVar1.index;
    local_10 = sVar1.name_value_match;
  }
  else if (_name_only == (nghttp2_hd_entry *)0x0) {
    context_local = (nghttp2_hd_context *)ent;
    local_10 = (int)res.index;
  }
  else {
    context_local = (nghttp2_hd_context *)(ulong)((context->next_seq - _name_only->seq) + 0x3c);
    local_10 = local_5c;
  }
  sVar1.name_value_match = local_10;
  sVar1.index = (ssize_t)context_local;
  sVar1._12_4_ = 0;
  return sVar1;
}

Assistant:

static search_result search_hd_table(nghttp2_hd_context *context,
                                     const nghttp2_nv *nv, int32_t token,
                                     int indexing_mode, nghttp2_hd_map *map,
                                     uint32_t hash) {
  search_result res = {-1, 0};
  const nghttp2_hd_entry *ent;
  int exact_match;
  int name_only = indexing_mode == NGHTTP2_HD_NEVER_INDEXING;

  exact_match = 0;
  ent = hd_map_find(map, &exact_match, nv, token, hash, name_only);

  if (!exact_match && token >= 0 && token <= NGHTTP2_TOKEN_WWW_AUTHENTICATE) {
    return search_static_table(nv, token, name_only);
  }

  if (ent == NULL) {
    return res;
  }

  res.index =
      (ssize_t)(context->next_seq - 1 - ent->seq + NGHTTP2_STATIC_TABLE_LENGTH);
  res.name_value_match = exact_match;

  return res;
}